

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddWalsh.c
# Opt level: O2

DdNode * Cudd_addWalsh(DdManager *dd,DdNode **x,DdNode **y,int n)

{
  int *piVar1;
  int iVar2;
  DdNode *pDVar3;
  DdNode *pDVar4;
  DdNode *n_00;
  DdNode *pDVar5;
  DdNode *g;
  uint uVar6;
  
  iVar2 = n + -1;
  do {
    dd->reordered = 0;
    pDVar5 = dd->one;
    if (n == 0) {
      return pDVar5;
    }
    pDVar3 = cuddUniqueConst(dd,-1.0);
    if (pDVar3 == (DdNode *)0x0) {
LAB_00642a62:
      n_00 = (DdNode *)0x0;
    }
    else {
      piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      pDVar4 = Cudd_addIte(dd,y[iVar2],pDVar3,pDVar5);
      if (pDVar4 == (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,pDVar3);
      }
      else {
        piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        n_00 = Cudd_addIte(dd,x[iVar2],pDVar4,pDVar5);
        if (n_00 != (DdNode *)0x0) {
          piVar1 = (int *)(((ulong)n_00 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          Cudd_RecursiveDeref(dd,pDVar4);
          if (n < 2) {
            pDVar5 = (DdNode *)0x0;
          }
          else {
            pDVar4 = Cudd_addIte(dd,y[iVar2],pDVar5,pDVar3);
            if (pDVar4 == (DdNode *)0x0) {
              Cudd_RecursiveDeref(dd,pDVar3);
              Cudd_RecursiveDeref(dd,n_00);
              goto LAB_00642a62;
            }
            piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
            pDVar5 = Cudd_addIte(dd,x[iVar2],pDVar4,pDVar3);
            if (pDVar5 == (DdNode *)0x0) {
              Cudd_RecursiveDeref(dd,pDVar3);
              Cudd_RecursiveDeref(dd,n_00);
              Cudd_RecursiveDeref(dd,pDVar4);
              n_00 = (DdNode *)0x0;
              goto LAB_00642a65;
            }
            piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
            Cudd_RecursiveDeref(dd,pDVar4);
          }
          piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + -1;
          uVar6 = n - 2;
          while (-1 < (int)uVar6) {
            pDVar3 = Cudd_addIte(dd,y[uVar6],pDVar5,n_00);
            if (pDVar3 == (DdNode *)0x0) {
              Cudd_RecursiveDeref(dd,n_00);
LAB_00642a33:
              Cudd_RecursiveDeref(dd,pDVar5);
              n_00 = (DdNode *)0x0;
              goto LAB_00642a65;
            }
            piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
            pDVar4 = Cudd_addIte(dd,x[uVar6],pDVar3,n_00);
            if (pDVar4 == (DdNode *)0x0) {
              Cudd_RecursiveDeref(dd,n_00);
              Cudd_RecursiveDeref(dd,pDVar5);
              pDVar5 = pDVar3;
              goto LAB_00642a33;
            }
            piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
            Cudd_RecursiveDeref(dd,pDVar3);
            pDVar3 = pDVar5;
            if (uVar6 != 0) {
              g = Cudd_addIte(dd,y[uVar6],n_00,pDVar5);
              if (g == (DdNode *)0x0) {
                Cudd_RecursiveDeref(dd,n_00);
                Cudd_RecursiveDeref(dd,pDVar5);
                Cudd_RecursiveDeref(dd,pDVar4);
                n_00 = (DdNode *)0x0;
                goto LAB_00642a65;
              }
              piVar1 = (int *)(((ulong)g & 0xfffffffffffffffe) + 4);
              *piVar1 = *piVar1 + 1;
              pDVar3 = Cudd_addIte(dd,x[uVar6],g,pDVar5);
              piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
              *piVar1 = *piVar1 + 1;
              Cudd_RecursiveDeref(dd,g);
            }
            Cudd_RecursiveDeref(dd,n_00);
            Cudd_RecursiveDeref(dd,pDVar5);
            pDVar5 = pDVar3;
            n_00 = pDVar4;
            uVar6 = uVar6 - 1;
          }
          piVar1 = (int *)(((ulong)n_00 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + -1;
          goto LAB_00642a65;
        }
        Cudd_RecursiveDeref(dd,pDVar3);
        Cudd_RecursiveDeref(dd,pDVar4);
      }
      n_00 = (DdNode *)0x0;
    }
LAB_00642a65:
    if (dd->reordered != 1) {
      return n_00;
    }
  } while( true );
}

Assistant:

DdNode *
Cudd_addWalsh(
  DdManager * dd,
  DdNode ** x,
  DdNode ** y,
  int  n)
{
    DdNode *res;

    do {
        dd->reordered = 0;
        res = addWalshInt(dd, x, y, n);
    } while (dd->reordered == 1);
    return(res);

}